

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O2

int8_t __thiscall
I2Cdev::readWords(I2Cdev *this,uint8_t regAddr,uint8_t length,uint16_t *data,uint16_t timeout)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  uint uVar5;
  char *__format;
  char cVar6;
  FILE *pFVar7;
  uint8_t regAddr_local;
  
  __fd = open(&(this->super_I2Cgeneric).field_0xd,2);
  pFVar7 = _stderr;
  if (__fd < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar7,"Failed to open device: %s\n",pcVar4);
    return -1;
  }
  iVar1 = ioctl(__fd,0x703,(ulong)(byte)(this->super_I2Cgeneric).field_0xc);
  pFVar7 = _stderr;
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    __format = "Failed to select device: %s\n";
  }
  else {
    sVar2 = write(__fd,&regAddr_local,1);
    pFVar7 = _stderr;
    if (sVar2 == 1) {
      sVar2 = read(__fd,data,(ulong)((uint)length * 2));
      pFVar7 = _stderr;
      cVar6 = (char)sVar2;
      uVar5 = (uint)cVar6;
      if (cVar6 < '\0') {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar7,"Failed to read device(%d): %s\n",(ulong)uVar5,pcVar4);
      }
      else {
        if (uVar5 >> 1 == (uint)length) {
          close(__fd);
          return cVar6;
        }
        fprintf(_stderr,"Short read  from device, expected %d, got %d\n",length,(ulong)uVar5);
      }
      goto LAB_00108910;
    }
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    __format = "Failed to write reg: %s\n";
  }
  fprintf(pFVar7,__format,pcVar4);
LAB_00108910:
  close(__fd);
  return -1;
}

Assistant:

int8_t I2Cdev::readWords(uint8_t regAddr, uint8_t length, uint16_t *data, uint16_t timeout) {
    //int8_t count = 0;

    // Use readBytes() and potential byteswap
    //printf("ReadWords() not implemented\n");
    // keep the compiler quiet
    /**data = 0;
    (void)regAddr;
    (void)length;
    (void)timeout;

    return count;*/
    int8_t count = 0;
    int fd = open(this->i2c_path, O_RDWR);

    if (fd < 0) {
        fprintf(stderr, "Failed to open device: %s\n", strerror(errno));
        return(-1);
    }
    if (ioctl(fd, I2C_SLAVE, this->address) < 0) {
        fprintf(stderr, "Failed to select device: %s\n", strerror(errno));
        close(fd);
        return(-1);
    }
    if (write(fd, &regAddr, 1) != 1) {
        fprintf(stderr, "Failed to write reg: %s\n", strerror(errno));
        close(fd);
        return(-1);
    }
    count = read(fd, data, length*2);
    if (count < 0) {
        fprintf(stderr, "Failed to read device(%d): %s\n", count, ::strerror(errno));
        close(fd);
        return(-1);
    } else if (count/2 != length) {
        fprintf(stderr, "Short read  from device, expected %d, got %d\n", length, count);
        close(fd);
        return(-1);
    }
    close(fd);

    // Suppress compiler warning
    (void)timeout;

    return count;
}